

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_reset_compressedBlockState(ZSTD_compressedBlockState_t *bs)

{
  int i;
  ZSTD_compressedBlockState_t *bs_local;
  
  for (i = 0; i < 3; i = i + 1) {
    bs->rep[i] = repStartValue[i];
  }
  (bs->entropy).hufCTable_repeatMode = HUF_repeat_none;
  (bs->entropy).offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).litlength_repeatMode = FSE_repeat_none;
  return;
}

Assistant:

static void ZSTD_reset_compressedBlockState(ZSTD_compressedBlockState_t* bs)
{
    int i;
    for (i = 0; i < ZSTD_REP_NUM; ++i)
        bs->rep[i] = repStartValue[i];
    bs->entropy.hufCTable_repeatMode = HUF_repeat_none;
    bs->entropy.offcode_repeatMode = FSE_repeat_none;
    bs->entropy.matchlength_repeatMode = FSE_repeat_none;
    bs->entropy.litlength_repeatMode = FSE_repeat_none;
}